

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  string *variable;
  string *variable_00;
  _Alloc_hider _Var1;
  bool bVar2;
  Option *pOVar3;
  initializer_list<std::basic_ostream<char,_std::char_traits<char>_>_*> __l;
  LemmaProcessor *local_840;
  _Head_base<0UL,_uttamarin::TheoryPreprocessor_*,_false> local_838;
  _Head_base<0UL,_uttamarin::LemmaProcessor_*,_false> local_830;
  undefined1 local_828 [8];
  shared_ptr<uttamarin::UtTamarinConfig> config;
  App app;
  undefined1 local_7e0 [8];
  shared_ptr<uttamarin::OutputWriter> output_writer;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  output_streams;
  __shared_ptr<uttamarin::UtTamarinConfig,_(__gnu_cxx::_Lock_policy)2> local_7b0;
  __shared_ptr<uttamarin::OutputWriter,_(__gnu_cxx::_Lock_policy)2> local_7a0;
  __shared_ptr<uttamarin::UtTamarinConfig,_(__gnu_cxx::_Lock_policy)2> local_790;
  vector<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_> local_780;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  CmdParameters parameters;
  ofstream output_file_stream;
  App cli;
  
  uttamarin::termination::registerSIGINTHandler();
  parameters.spthy_file_path._M_dataplus._M_p = (pointer)&parameters.spthy_file_path.field_2;
  parameters.spthy_file_path._M_string_length = 0;
  parameters.spthy_file_path.field_2._M_local_buf[0] = '\0';
  parameters.config_file_path._M_dataplus._M_p = (pointer)&parameters.config_file_path.field_2;
  parameters.config_file_path._M_string_length = 0;
  parameters.config_file_path.field_2._M_local_buf[0] = '\0';
  parameters.output_file_path._M_dataplus._M_p = (pointer)&parameters.output_file_path.field_2;
  parameters.output_file_path._M_string_length = 0;
  parameters.output_file_path.field_2._M_local_buf[0] = '\0';
  parameters.starting_lemma._M_dataplus._M_p = (pointer)&parameters.starting_lemma.field_2;
  parameters.starting_lemma._M_string_length = 0;
  parameters.starting_lemma.field_2._M_local_buf[0] = '\0';
  parameters.penetration_lemma._M_dataplus._M_p = (pointer)&parameters.penetration_lemma.field_2;
  parameters.penetration_lemma._M_string_length = 0;
  parameters.penetration_lemma.field_2._M_local_buf[0] = '\0';
  parameters.proof_directory._M_dataplus._M_p = (pointer)&parameters.proof_directory.field_2;
  parameters.proof_directory._M_string_length = 0;
  parameters.proof_directory.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,
             "UT Tamarin is a small tool that runs the Tamarin prover on selected\nlemmas and outputs statistics."
             ,(allocator<char> *)&output_file_stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"",(allocator<char> *)&app);
  CLI::App::App(&cli,&local_508,&local_528);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::assign((char *)&parameters);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"spthy_file",(allocator<char> *)&output_file_stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"Path to a .spthy file containing a Tamarin theory.",
             (allocator<char> *)&app);
  pOVar3 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&cli,&local_548,&parameters.spthy_file_path,&local_568);
  (pOVar3->super_OptionBase<CLI::Option>).required_ = true;
  CLI::Option::check(pOVar3,(Validator *)CLI::ExistingFile);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_548);
  parameters.abort_after_failure = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,"-a,--abort_after_failure",(allocator<char> *)&output_file_stream)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"Tells the tool to abort if Tamarin fails to prove a lemma.",
             (allocator<char> *)&app);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (&cli,&local_588,&parameters.abort_after_failure,&local_5a8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_588);
  parameters.is_quiet = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c8,"-q,--quiet",(allocator<char> *)&output_file_stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e8,"Disables the timer on the command line.",(allocator<char> *)&app)
  ;
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(&cli,&local_5c8,&parameters.is_quiet,&local_5e8)
  ;
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::assign((char *)&parameters.config_file_path);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"-c,--config_file",(allocator<char> *)&output_file_stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"Configuration file for UT Tamarin.",(allocator<char> *)&app);
  pOVar3 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&cli,&local_608,&parameters.config_file_path,&local_628);
  CLI::Option::check(pOVar3,(Validator *)CLI::ExistingFile);
  variable = &parameters.output_file_path;
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::assign((char *)variable);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"-o,--output_file",(allocator<char> *)&output_file_stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,"File where UT Tamarin saves its output.",(allocator<char> *)&app)
  ;
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&cli,&local_648,variable,&local_668);
  variable_00 = &parameters.proof_directory;
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::assign((char *)variable_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_688,"-p, --proof_directory",(allocator<char> *)&output_file_stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"Directory where the proofs should be stored.",
             (allocator<char> *)&app);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&cli,&local_688,variable_00,&local_6a8);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::assign((char *)&parameters.penetration_lemma);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c8,"--penetration_lemma",(allocator<char> *)&output_file_stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"Lemma to penetrate.",(allocator<char> *)&app);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&cli,&local_6c8,&parameters.penetration_lemma,&local_6e8);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::assign((char *)&parameters.starting_lemma);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,"-s,--start",(allocator<char> *)&output_file_stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"Name of the first lemma that should be verified.",
             (allocator<char> *)&app);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&cli,&local_708,&parameters.starting_lemma,&local_728);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_708);
  parameters.timeout = 600;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,"-t,--timeout",(allocator<char> *)&output_file_stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,
             "Per-lemma timeout in seconds (0 means no timeout, default: 600 seconds).",
             (allocator<char> *)&app);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(&cli,&local_748,&parameters.timeout,&local_768)
  ;
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_748);
  CLI::App::parse(&cli,argc,argv);
  std::make_shared<uttamarin::UtTamarinConfig,uttamarin::CmdParameters&>((CmdParameters *)&config);
  std::make_unique<uttamarin::BashLemmaProcessor,std::__cxx11::string&,int&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &output_file_stream,(int *)variable_00);
  _Var1._M_p = _output_file_stream;
  local_840 = (LemmaProcessor *)_output_file_stream;
  if (parameters.is_quiet == false) {
    std::
    make_unique<uttamarin::VerboseLemmaProcessor,std::unique_ptr<uttamarin::LemmaProcessor,std::default_delete<uttamarin::LemmaProcessor>>>
              ((unique_ptr<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>_>
                *)&output_file_stream);
    local_840 = (LemmaProcessor *)_output_file_stream;
    _output_file_stream = (pointer)0x0;
    if (((long *)_Var1._M_p != (long *)0x0) &&
       ((**(code **)(*(long *)_Var1._M_p + 8))(), (long *)_output_file_stream != (long *)0x0)) {
      (**(code **)(*(long *)_output_file_stream + 8))();
    }
  }
  std::make_unique<uttamarin::M4TheoryPreprocessor,std::shared_ptr<uttamarin::UtTamarinConfig>&>
            ((shared_ptr<uttamarin::UtTamarinConfig> *)local_828);
  _output_file_stream = (pointer)&std::cout;
  __l._M_len = 1;
  __l._M_array = (iterator)&output_file_stream;
  CLI::std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::vector(&output_streams,__l,(allocator_type *)&app);
  std::ofstream::ofstream(&output_file_stream);
  bVar2 = std::operator!=(variable,"");
  if (bVar2) {
    std::ofstream::open((string *)&output_file_stream,(_Ios_Openmode)variable);
    app.lemma_processor_._M_t.
    super___uniq_ptr_impl<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>_>
    ._M_t.
    super__Tuple_impl<0UL,_uttamarin::LemmaProcessor_*,_std::default_delete<uttamarin::LemmaProcessor>_>
    .super__Head_base<0UL,_uttamarin::LemmaProcessor_*,_false>._M_head_impl =
         (__uniq_ptr_data<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>,_true,_true>
          )(__uniq_ptr_data<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>,_true,_true>
            )&output_file_stream;
    std::vector<std::ostream*,std::allocator<std::ostream*>>::emplace_back<std::ofstream*>
              ((vector<std::ostream*,std::allocator<std::ostream*>> *)&output_streams,
               (basic_ofstream<char,_std::char_traits<char>_> **)&app);
  }
  std::
  make_shared<uttamarin::OutputWriter,std::vector<std::ostream*,std::allocator<std::ostream*>>&>
            ((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              *)&output_writer);
  local_838._M_head_impl = (TheoryPreprocessor *)local_828;
  local_828 = (undefined1  [8])0x0;
  local_830._M_head_impl = local_840;
  CLI::std::__shared_ptr<uttamarin::UtTamarinConfig,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_790,
             &config.super___shared_ptr<uttamarin::UtTamarinConfig,_(__gnu_cxx::_Lock_policy)2>);
  CLI::std::__shared_ptr<uttamarin::OutputWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_7a0,
             &output_writer.super___shared_ptr<uttamarin::OutputWriter,_(__gnu_cxx::_Lock_policy)2>)
  ;
  uttamarin::App::App(&app,(unique_ptr<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>_>
                            *)&local_830,
                      (unique_ptr<uttamarin::TheoryPreprocessor,_std::default_delete<uttamarin::TheoryPreprocessor>_>
                       *)&local_838,(shared_ptr<uttamarin::UtTamarinConfig> *)&local_790,
                      (shared_ptr<uttamarin::OutputWriter> *)&local_7a0);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7a0._M_refcount);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_790._M_refcount);
  if ((element_type *)local_838._M_head_impl != (element_type *)0x0) {
    (**(code **)((((string *)&(local_838._M_head_impl)->_vptr_TheoryPreprocessor)->_M_dataplus)._M_p
                + 8))();
  }
  local_838._M_head_impl = (TheoryPreprocessor *)0x0;
  if (local_830._M_head_impl != (LemmaProcessor *)0x0) {
    (*(local_830._M_head_impl)->_vptr_LemmaProcessor[1])();
  }
  local_830._M_head_impl = (LemmaProcessor *)0x0;
  CLI::std::__shared_ptr<uttamarin::UtTamarinConfig,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_7b0,
             &config.super___shared_ptr<uttamarin::UtTamarinConfig,_(__gnu_cxx::_Lock_policy)2>);
  CreateLemmaJobGenerator
            ((CmdParameters *)local_7e0,(shared_ptr<uttamarin::UtTamarinConfig> *)&parameters);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7b0._M_refcount);
  (**(code **)(*(long *)local_7e0 + 0x10))(&local_780,local_7e0);
  uttamarin::App::RunOnLemmas(&app,&local_780);
  CLI::std::vector<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_>::~vector
            ((vector<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_> *)&local_780);
  (**(code **)(*(long *)local_7e0 + 8))(local_7e0);
  uttamarin::App::~App(&app);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&output_writer.super___shared_ptr<uttamarin::OutputWriter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::ofstream::~ofstream(&output_file_stream);
  CLI::std::
  _Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::~_Vector_base(&output_streams.
                   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 );
  if (local_828 != (undefined1  [8])0x0) {
    (**(code **)((((string *)local_828)->_M_dataplus)._M_p + 8))();
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&config.super___shared_ptr<uttamarin::UtTamarinConfig,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CLI::App::~App(&cli);
  uttamarin::CmdParameters::~CmdParameters(&parameters);
  return 0;
}

Assistant:

int main (int argc, char *argv[])
{
  termination::registerSIGINTHandler();

  CmdParameters parameters;

  CLI::App cli{
    "UT Tamarin is a small tool that runs the Tamarin prover on selected\n"
    "lemmas and outputs statistics." 
  };

  parameters.spthy_file_path = "";
  cli.add_option("spthy_file", parameters.spthy_file_path,
                 "Path to a .spthy file containing a Tamarin theory."
  )->required()->check(CLI::ExistingFile);

  parameters.abort_after_failure = true;
  cli.add_flag("-a,--abort_after_failure",
               parameters.abort_after_failure,
               "Tells the tool to abort if Tamarin fails to prove a lemma.");

  parameters.is_quiet = false;
  cli.add_flag("-q,--quiet",
               parameters.is_quiet,
               "Disables the timer on the command line.");

  parameters.config_file_path = "";
  cli.add_option("-c,--config_file", parameters.config_file_path,
                 "Configuration file for UT Tamarin."
  )->check(CLI::ExistingFile);

  parameters.output_file_path = "";
  cli.add_option("-o,--output_file", parameters.output_file_path,
                 "File where UT Tamarin saves its output.");

  parameters.proof_directory = "";
  cli.add_option("-p, --proof_directory", parameters.proof_directory,
                 "Directory where the proofs should be stored.");

  parameters.penetration_lemma = "";
  cli.add_option("--penetration_lemma", parameters.penetration_lemma,
                 "Lemma to penetrate.");

  parameters.starting_lemma = "";
  cli.add_option("-s,--start", parameters.starting_lemma,
                 "Name of the first lemma that should be verified.");

  parameters.timeout = 600;
  cli.add_option("-t,--timeout", parameters.timeout,
                 "Per-lemma timeout in seconds "
                 "(0 means no timeout, default: 600 seconds).");

  CLI11_PARSE(cli, argc, argv);

  auto config = std::make_shared<UtTamarinConfig>(parameters);

  std::unique_ptr<LemmaProcessor> lemma_processor =
          std::make_unique<BashLemmaProcessor>(parameters.proof_directory,
                                               parameters.timeout);

  if(!parameters.is_quiet) {
    lemma_processor =
          std::make_unique<VerboseLemmaProcessor>(std::move(lemma_processor));
  }

  auto theory_preprocessor = std::make_unique<M4TheoryPreprocessor>(config);

  std::vector<std::ostream*> output_streams = std::vector{&std::cout};
  std::ofstream output_file_stream;
  if(parameters.output_file_path != "") {
    output_file_stream.open(parameters.output_file_path);
    output_streams.emplace_back(&output_file_stream);
  }
  auto output_writer = std::make_shared<OutputWriter>(output_streams);

  App app (std::move(lemma_processor),
           std::move(theory_preprocessor),
           config,
           output_writer);

  auto lemma_job_generator = CreateLemmaJobGenerator(parameters, config);

  app.RunOnLemmas(lemma_job_generator->GenerateLemmaJobs());

  return 0;
}